

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_narrow.c
# Opt level: O0

TRef lj_opt_narrow_unm(jit_State *J,TRef rc,TValue *vc)

{
  IRRef1 IVar1;
  TRef TVar2;
  TRef zero;
  uint32_t k;
  TValue *vc_local;
  TRef rc_local;
  jit_State *J_local;
  
  vc_local._4_4_ = conv_str_tonum(J,rc,vc);
  if ((vc_local._4_4_ >> 0x18 & 0x1f) - 0xf < 5) {
    IVar1 = (IRRef1)vc_local._4_4_;
    if (((int)vc->n != 0) && ((int)vc->n != -0x80000000)) {
      TVar2 = lj_ir_kint(J,0);
      (J->fold).ins.field_0.ot = 0x993;
      (J->fold).ins.field_0.op1 = IVar1;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
      lj_opt_fold(J);
      (J->fold).ins.field_0.ot = 0x3693;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
      (J->fold).ins.field_0.op2 = IVar1;
      TVar2 = lj_opt_fold(J);
      return TVar2;
    }
    (J->fold).ins.field_0.ot = 0x5b0e;
    (J->fold).ins.field_0.op1 = IVar1;
    (J->fold).ins.field_0.op2 = 0x1d3;
    vc_local._4_4_ = lj_opt_fold(J);
  }
  TVar2 = lj_ir_ggfload(J,IRT_NUM,
                        ((ulong)((long)J->ksimd + 0x1fU) & 0xfffffffffffffff0) -
                        (long)&J[-1].penalty[0x1d].val);
  (J->fold).ins.field_0.ot = 0x2f0e;
  (J->fold).ins.field_0.op1 = (IRRef1)vc_local._4_4_;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
  TVar2 = lj_opt_fold(J);
  return TVar2;
}

Assistant:

TRef lj_opt_narrow_unm(jit_State *J, TRef rc, TValue *vc)
{
  rc = conv_str_tonum(J, rc, vc);
  if (tref_isinteger(rc)) {
    uint32_t k = (uint32_t)numberVint(vc);
    if ((LJ_DUALNUM || k != 0) && k != 0x80000000u) {
      TRef zero = lj_ir_kint(J, 0);
      if (!LJ_DUALNUM)
	emitir(IRTGI(IR_NE), rc, zero);
      return emitir(IRTGI(IR_SUBOV), zero, rc);
    }
    rc = emitir(IRTN(IR_CONV), rc, IRCONV_NUM_INT);
  }
  return emitir(IRTN(IR_NEG), rc, lj_ir_ksimd(J, LJ_KSIMD_NEG));
}